

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef __thiscall llvm::sys::path::stem(path *this,StringRef path,Style style)

{
  size_t sVar1;
  StringRef SVar2;
  StringRef path_00;
  size_t sStack_20;
  StringRef fname;
  
  path_00.Length = path.Data;
  path_00.Data = (char *)this;
  fname = filename(path_00,(Style)path.Length);
  sVar1 = StringRef::rfind(&fname,'.',0xffffffffffffffff);
  if (sVar1 != 0xffffffffffffffff) {
    if (fname.Length == 2) {
      if (*(short *)fname.Data == 0x2e2e) {
        sStack_20 = 2;
        fname.Length = sStack_20;
        goto LAB_0014b7ff;
      }
    }
    else if ((fname.Length == 1) && (*fname.Data == '.')) {
      sStack_20 = 1;
      fname.Length = sStack_20;
      goto LAB_0014b7ff;
    }
    if (sVar1 <= fname.Length) {
      fname.Length = sVar1;
    }
  }
LAB_0014b7ff:
  SVar2.Length = fname.Length;
  SVar2.Data = fname.Data;
  return SVar2;
}

Assistant:

StringRef stem(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return fname;
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return fname;
    else
      return fname.substr(0, pos);
}